

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::DeleteLogDestinations(void)

{
  LogFileObject *this;
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  int severity;
  long lVar4;
  MutexLock l;
  MutexLock local_20;
  
  lVar4 = 0;
  do {
    this = (LogFileObject *)(&log_destinations_)[lVar4];
    if (this != (LogFileObject *)0x0) {
      anon_unknown_10::LogFileObject::~LogFileObject(this);
    }
    operator_delete(this,0xe0);
    (&log_destinations_)[lVar4] = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_20.mu_ = (Mutex *)sink_mutex_;
  if (sink_mutex_[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)sink_mutex_);
    if (iVar3 != 0) {
      abort();
    }
  }
  puVar2 = sinks_;
  if ((sinks_ != (undefined8 *)0x0) && (pvVar1 = (void *)*sinks_, pvVar1 != (void *)0x0)) {
    operator_delete(pvVar1,sinks_[2] - (long)pvVar1);
  }
  operator_delete(puVar2,0x18);
  sinks_ = (undefined8 *)0x0;
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    delete log_destinations_[severity];
    log_destinations_[severity] = NULL;
  }
  MutexLock l(&sink_mutex_);
  delete sinks_;
  sinks_ = NULL;
}